

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_pmovmskb_mips(uint64_t fs)

{
  uint fd;
  uint64_t fs_local;
  
  return (ulong)((uint)(fs >> 7) & 1 | (uint)((fs >> 0xf & 1) << 1) | (uint)((fs >> 0x17 & 1) << 2)
                 | (uint)((fs >> 0x1f & 1) << 3) | (uint)((fs >> 0x27 & 1) << 4) |
                 (uint)((fs >> 0x2f & 1) << 5) | (uint)((fs >> 0x37 & 1) << 6) |
                (uint)((fs >> 0x3f) << 7));
}

Assistant:

uint64_t helper_pmovmskb(uint64_t fs)
{
    unsigned fd = 0;

    fd |= ((fs >>  7) & 1) << 0;
    fd |= ((fs >> 15) & 1) << 1;
    fd |= ((fs >> 23) & 1) << 2;
    fd |= ((fs >> 31) & 1) << 3;
    fd |= ((fs >> 39) & 1) << 4;
    fd |= ((fs >> 47) & 1) << 5;
    fd |= ((fs >> 55) & 1) << 6;
    fd |= ((fs >> 63) & 1) << 7;

    return fd & 0xff;
}